

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c-writer.cc
# Opt level: O3

void __thiscall wabt::anon_unknown_0::CWriter::WriteTableType(CWriter *this,Type *type)

{
  size_t size;
  int iVar1;
  char *__s;
  
  iVar1 = (int)type;
  if (iVar1 == -0x17) {
    __s = "exnref";
  }
  else if (iVar1 == -0x10) {
    __s = "funcref";
  }
  else {
    if (iVar1 != -0x11) {
      abort();
    }
    __s = "externref";
  }
  WriteData(this,"wasm_rt_",8);
  size = strlen(__s);
  WriteData(this,__s,size);
  WriteData(this,"_table_t",8);
  return;
}

Assistant:

void CWriter::WriteTableType(const wabt::Type& type) {
  Write("wasm_rt_", GetReferenceTypeName(type), "_table_t");
}